

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::RemoveAt(CopyRemovePolicy<JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
           *this,List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *list,int index)

{
  WriteBarrierPtr<TestObject> *pWVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  long lVar6;
  
  if ((index < 0) ||
     ((list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                                ,0x2ee,"(index >= 0 && index < list->count)",
                                "index >= 0 && index < list->count");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  lVar6 = (long)(index + 1) << 3;
  while( true ) {
    iVar4 = (list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count;
    if (iVar4 <= index + 1) break;
    pWVar1 = (list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).buffer.ptr;
    Memory::WriteBarrierPtr<TestObject>::operator=
              (pWVar1 + index,(WriteBarrierPtr<TestObject> *)((long)&pWVar1->ptr + lVar6));
    lVar6 = lVar6 + 8;
    index = index + 1;
  }
  iVar4 = iVar4 + -1;
  (list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count = iVar4;
  (list->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).buffer.ptr[iVar4].ptr
       = (TestObject *)0x0;
  return;
}

Assistant:

void RemoveAt(TListType* list, int index)
        {
            Assert(index >= 0 && index < list->count);
            for (int j = index + 1; j < list->count; index++, j++)
            {
                list->buffer[index] = list->buffer[j];
            }
            list->count--;

            if (clearOldEntries)
            {
                ClearArray(list->buffer + list->count, 1);
            }
        }